

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws.c
# Opt level: O3

void nn_aws_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_fsm *in_RAX;
  nn_fsm *pnVar2;
  
  if (type == -3 && src == -2) {
LAB_00131c6e:
    nn_aws_shutdown_cold_2();
    pnVar2 = in_RAX;
  }
  else {
    pnVar2 = self + 1;
    if (*(int *)&self[1].fn == 8) goto LAB_00131c9f;
    if (*(int *)&self[1].fn != 7) {
      nn_aws_shutdown_cold_1();
      goto LAB_00131c6e;
    }
  }
  iVar1 = nn_sws_isidle((nn_sws *)&self[8].owner);
  if (iVar1 == 0) {
    return;
  }
  nn_usock_stop((nn_usock *)&self[1].state);
  *(undefined4 *)&pnVar2->fn = 8;
LAB_00131c9f:
  iVar1 = nn_usock_isidle((nn_usock *)&self[1].state);
  if (iVar1 == 0) {
    return;
  }
  if ((nn_usock *)self[8].shutdown_fn != (nn_usock *)0x0) {
    if (self[8].srcptr == (void *)0x0) {
      nn_aws_shutdown_cold_3();
    }
    nn_usock_swap_owner((nn_usock *)self[8].shutdown_fn,(nn_fsm_owner *)&self[8].state);
    self[8].shutdown_fn = (nn_fsm_fn)0x0;
    self[8].state = -1;
    self[8].srcptr = (void *)0x0;
  }
  *(undefined4 *)&pnVar2->fn = 1;
  nn_fsm_stopped(self,0x85b9);
  return;
}

Assistant:

static void nn_aws_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_aws *aws;

    aws = nn_cont (self, struct nn_aws, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (!nn_sws_isidle (&aws->sws)) {
            nn_ep_stat_increment (aws->ep, NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_sws_stop (&aws->sws);
        }
        aws->state = NN_AWS_STATE_STOPPING_SWS_FINAL;
    }
    if (nn_slow (aws->state == NN_AWS_STATE_STOPPING_SWS_FINAL)) {
        if (!nn_sws_isidle (&aws->sws))
            return;
        nn_usock_stop (&aws->usock);
        aws->state = NN_AWS_STATE_STOPPING;
    }
    if (nn_slow (aws->state == NN_AWS_STATE_STOPPING)) {
        if (!nn_usock_isidle (&aws->usock))
            return;
       if (aws->listener) {
            nn_assert (aws->listener_owner.fsm);
            nn_usock_swap_owner (aws->listener, &aws->listener_owner);
            aws->listener = NULL;
            aws->listener_owner.src = -1;
            aws->listener_owner.fsm = NULL;
        }
        aws->state = NN_AWS_STATE_IDLE;
        nn_fsm_stopped (&aws->fsm, NN_AWS_STOPPED);
        return;
    }

    nn_fsm_bad_action (aws->state, src, type);
}